

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O1

int xmlSchemaIDCStoreNodeTableItem(xmlSchemaValidCtxtPtr vctxt,xmlSchemaPSVIIDCNodePtr item)

{
  int iVar1;
  xmlSchemaPSVIIDCNodePtr *ppxVar2;
  uint uVar3;
  uint uVar4;
  
  iVar1 = vctxt->sizeIdcNodes;
  if (iVar1 <= vctxt->nbIdcNodes) {
    if (iVar1 < 1) {
      uVar4 = 0x14;
    }
    else {
      uVar4 = 0xffffffff;
      if (iVar1 < 1000000000) {
        uVar3 = iVar1 + 1U >> 1;
        uVar4 = uVar3 + iVar1;
        if ((int)(1000000000 - uVar3) < iVar1) {
          uVar4 = 1000000000;
        }
      }
    }
    if (((int)uVar4 < 0) ||
       (ppxVar2 = (xmlSchemaPSVIIDCNodePtr *)(*xmlRealloc)(vctxt->idcNodes,(ulong)uVar4 << 3),
       ppxVar2 == (xmlSchemaPSVIIDCNodePtr *)0x0)) {
      xmlSchemaVErrMemory(vctxt);
      return -1;
    }
    vctxt->idcNodes = ppxVar2;
    vctxt->sizeIdcNodes = uVar4;
  }
  iVar1 = vctxt->nbIdcNodes;
  vctxt->nbIdcNodes = iVar1 + 1;
  vctxt->idcNodes[iVar1] = item;
  return 0;
}

Assistant:

static int
xmlSchemaIDCStoreNodeTableItem(xmlSchemaValidCtxtPtr vctxt,
			       xmlSchemaPSVIIDCNodePtr item)
{
    /*
    * Add to global list.
    */
    if (vctxt->sizeIdcNodes <= vctxt->nbIdcNodes) {
        xmlSchemaPSVIIDCNodePtr *tmp;
        int newSize;

        newSize = xmlGrowCapacity(vctxt->sizeIdcNodes, sizeof(tmp[0]),
                                  20, XML_MAX_ITEMS);
	if (newSize < 0) {
	    xmlSchemaVErrMemory(vctxt);
	    return (-1);
	}
	tmp = xmlRealloc(vctxt->idcNodes, newSize * sizeof(tmp[0]));
	if (tmp == NULL) {
	    xmlSchemaVErrMemory(vctxt);
	    return (-1);
	}

        vctxt->idcNodes = tmp;
        vctxt->sizeIdcNodes = newSize;
    }

    vctxt->idcNodes[vctxt->nbIdcNodes++] = item;
    return (0);
}